

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::PaddingLayerParams::PaddingLayerParams
          (PaddingLayerParams *this,PaddingLayerParams *from)

{
  uint32 uVar1;
  void *pvVar2;
  BorderAmounts *from_00;
  BorderAmounts *this_00;
  PaddingLayerParams_PaddingConstant *this_01;
  PaddingLayerParams_PaddingReflection *this_02;
  PaddingLayerParams_PaddingReplication *this_03;
  PaddingLayerParams_PaddingReflection *from_01;
  PaddingLayerParams_PaddingReplication *from_02;
  PaddingLayerParams_PaddingConstant *from_03;
  
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__PaddingLayerParams_0040d068;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0x0;
  this->_cached_size_ = 0;
  pvVar2 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar2 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar2 & 0xfffffffffffffffe));
  }
  from_00 = from->paddingamounts_;
  if (from_00 == (BorderAmounts *)0x0 ||
      from == (PaddingLayerParams *)&_PaddingLayerParams_default_instance_) {
    this_00 = (BorderAmounts *)0x0;
  }
  else {
    this_00 = (BorderAmounts *)operator_new(0x30);
    BorderAmounts::BorderAmounts(this_00,from_00);
  }
  this->paddingamounts_ = this_00;
  this->_oneof_case_[0] = 0;
  uVar1 = from->_oneof_case_[0];
  if (uVar1 == 3) {
    clear_PaddingType(this);
    this->_oneof_case_[0] = 3;
    this_03 = (PaddingLayerParams_PaddingReplication *)operator_new(0x18);
    PaddingLayerParams_PaddingReplication::PaddingLayerParams_PaddingReplication(this_03);
    (this->PaddingType_).replication_ = this_03;
    if (from->_oneof_case_[0] == 3) {
      from_02 = (from->PaddingType_).replication_;
    }
    else {
      protobuf_NeuralNetwork_2eproto::InitDefaults();
      from_02 = (PaddingLayerParams_PaddingReplication *)
                &_PaddingLayerParams_PaddingReplication_default_instance_;
    }
    PaddingLayerParams_PaddingReplication::MergeFrom(this_03,from_02);
  }
  else if (uVar1 == 2) {
    clear_PaddingType(this);
    this->_oneof_case_[0] = 2;
    this_02 = (PaddingLayerParams_PaddingReflection *)operator_new(0x18);
    PaddingLayerParams_PaddingReflection::PaddingLayerParams_PaddingReflection(this_02);
    (this->PaddingType_).reflection_ = this_02;
    if (from->_oneof_case_[0] == 2) {
      from_01 = (from->PaddingType_).reflection_;
    }
    else {
      protobuf_NeuralNetwork_2eproto::InitDefaults();
      from_01 = (PaddingLayerParams_PaddingReflection *)
                &_PaddingLayerParams_PaddingReflection_default_instance_;
    }
    PaddingLayerParams_PaddingReflection::MergeFrom(this_02,from_01);
  }
  else if (uVar1 == 1) {
    clear_PaddingType(this);
    this->_oneof_case_[0] = 1;
    this_01 = (PaddingLayerParams_PaddingConstant *)operator_new(0x18);
    PaddingLayerParams_PaddingConstant::PaddingLayerParams_PaddingConstant(this_01);
    (this->PaddingType_).constant_ = this_01;
    if (from->_oneof_case_[0] == 1) {
      from_03 = (from->PaddingType_).constant_;
    }
    else {
      protobuf_NeuralNetwork_2eproto::InitDefaults();
      from_03 = (PaddingLayerParams_PaddingConstant *)
                &_PaddingLayerParams_PaddingConstant_default_instance_;
    }
    PaddingLayerParams_PaddingConstant::MergeFrom(this_01,from_03);
  }
  return;
}

Assistant:

PaddingLayerParams::PaddingLayerParams(const PaddingLayerParams& from)
  : ::google::protobuf::MessageLite(),
      _internal_metadata_(NULL),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  if (from.has_paddingamounts()) {
    paddingamounts_ = new ::CoreML::Specification::BorderAmounts(*from.paddingamounts_);
  } else {
    paddingamounts_ = NULL;
  }
  clear_has_PaddingType();
  switch (from.PaddingType_case()) {
    case kConstant: {
      mutable_constant()->::CoreML::Specification::PaddingLayerParams_PaddingConstant::MergeFrom(from.constant());
      break;
    }
    case kReflection: {
      mutable_reflection()->::CoreML::Specification::PaddingLayerParams_PaddingReflection::MergeFrom(from.reflection());
      break;
    }
    case kReplication: {
      mutable_replication()->::CoreML::Specification::PaddingLayerParams_PaddingReplication::MergeFrom(from.replication());
      break;
    }
    case PADDINGTYPE_NOT_SET: {
      break;
    }
  }
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.PaddingLayerParams)
}